

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

void __thiscall
tcu::TextureCubeArray::TextureCubeArray(TextureCubeArray *this,TextureCubeArray *other)

{
  int numLevels;
  ConstPixelBufferAccess *levels;
  TextureCubeArray *other_local;
  TextureCubeArray *this_local;
  
  TextureLevelPyramid::TextureLevelPyramid
            (&this->super_TextureLevelPyramid,&other->super_TextureLevelPyramid);
  this->m_size = other->m_size;
  this->m_depth = other->m_depth;
  numLevels = TextureLevelPyramid::getNumLevels(&this->super_TextureLevelPyramid);
  levels = &TextureLevelPyramid::getLevels(&this->super_TextureLevelPyramid)->
            super_ConstPixelBufferAccess;
  TextureCubeArrayView::TextureCubeArrayView(&this->m_view,numLevels,levels);
  return;
}

Assistant:

TextureCubeArray::TextureCubeArray (const TextureCubeArray& other)
	: TextureLevelPyramid	(other)
	, m_size				(other.m_size)
	, m_depth				(other.m_depth)
	, m_view				(getNumLevels(), getLevels())
{
	DE_ASSERT(m_depth % 6 == 0);
}